

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

StatusOr<google::protobuf::FeatureSetDefaults> * __thiscall
google::protobuf::FeatureResolver::CompileDefaults
          (StatusOr<google::protobuf::FeatureSetDefaults> *__return_storage_ptr__,
          FeatureResolver *this,Descriptor *feature_set,
          Span<const_google::protobuf::FieldDescriptor_*const> extensions,Edition minimum_edition,
          Edition maximum_edition)

{
  byte bVar1;
  ushort uVar2;
  FieldDescriptor *pFVar3;
  MessageLite *pMVar4;
  undefined8 uVar5;
  Descriptor *pDVar6;
  Nonnull<const_char_*> pcVar7;
  reference pEVar8;
  MessageLite *pMVar9;
  MessageLite *pMVar10;
  Message *overridable;
  void *pvVar11;
  void *pvVar12;
  undefined8 extraout_RAX;
  bool v1;
  pointer ppFVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
  *this_00;
  Arena *pAVar18;
  Edition EVar19;
  bool bVar20;
  iterator iVar21;
  Metadata MVar22;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  const_iterator other;
  string_view data;
  string_view data_00;
  string_view message;
  basic_string_view<char,_std::char_traits<char>_> args_3;
  Status _status_1;
  Status _status_3;
  __single_object message_factory;
  btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
  editions;
  FeatureSetDefaults defaults;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
  local_f8;
  undefined1 local_e8 [16];
  StatusRep local_d8;
  string local_a8;
  undefined1 local_88 [56];
  Descriptor *local_50;
  int local_44;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *local_40;
  long local_38;
  
  ppFVar13 = extensions.ptr_;
  EVar19 = (Edition)extensions.len_;
  local_50 = feature_set;
  if ((int)minimum_edition < (int)EVar19) {
    protobuf::(anonymous_namespace)::
    Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
              ((_anonymous_namespace_ *)local_88,"Invalid edition range, edition ",EVar19,
               " is newer than edition ",minimum_edition);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
               (Status *)local_88);
    if ((local_88._0_8_ & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_88._0_8_);
    }
  }
  else if (this == (FeatureResolver *)0x0) {
    protobuf::(anonymous_namespace)::Error<char_const*>
              ((_anonymous_namespace_ *)local_88,
               "Unable to find definition of google.protobuf.FeatureSet in descriptor pool.");
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
               (Status *)local_88);
    if ((local_88._0_8_ & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_88._0_8_);
    }
  }
  else {
    anon_unknown_21::ValidateDescriptor((anon_unknown_21 *)local_88,(Descriptor *)this);
    uVar5 = local_88._0_8_;
    if ((StatusRep *)local_88._0_8_ != (StatusRep *)0x1) {
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
      StatusOrData<const_absl::lts_20250127::Status,_0>
                (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
                 (Status *)local_88);
    }
    local_d8.message_.field_2._8_8_ = this;
    if ((local_88._0_8_ & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_88._0_8_);
    }
    if ((StatusRep *)uVar5 == (StatusRep *)0x1) {
      bVar20 = ppFVar13 == (pointer)0x0;
      if (!bVar20) {
        lVar16 = 0;
        do {
          pFVar3 = *(FieldDescriptor **)(&local_50->super_SymbolBase + lVar16);
          if (pFVar3 == (FieldDescriptor *)0x0) {
            pcVar14 = ((DescriptorNames *)(local_d8.message_.field_2._8_8_ + 0x10))->payload_;
            pcVar15 = (char *)(ulong)*(ushort *)(pcVar14 + 2);
            pcVar14 = pcVar14 + ~(ulong)pcVar15;
            pcVar17 = "Unknown extension of ";
LAB_00295055:
            args_1_00._M_str = pcVar15;
            args_1_00._M_len = (size_t)pcVar17;
            protobuf::(anonymous_namespace)::
            Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                      ((char *)&local_f8,args_1_00,pcVar14);
          }
          else if (pFVar3->containing_type_ == (Descriptor *)local_d8.message_.field_2._8_8_) {
            pDVar6 = FieldDescriptor::message_type(pFVar3);
            if (pDVar6 == (Descriptor *)0x0) {
              pcVar14 = (pFVar3->all_names_).payload_;
              pcVar15 = (char *)(ulong)*(ushort *)(pcVar14 + 2);
              pcVar14 = pcVar14 + ~(ulong)pcVar15;
              pcVar17 = "FeatureSet extension ";
              goto LAB_00295055;
            }
            bVar1 = pFVar3->field_0x1;
            v1 = (bool)((bVar1 & 0x20) >> 5);
            if (0xbf < bVar1 == v1) {
              pcVar7 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                 (v1,0xbf < bVar1,
                                  "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar7 != (Nonnull<const_char_*>)0x0) {
              CompileDefaults();
              absl::lts_20250127::Status::~Status((Status *)local_88);
              _Unwind_Resume(extraout_RAX);
            }
            if ((pFVar3->field_0x1 & 0x20) == 0) {
              pDVar6 = FieldDescriptor::message_type(pFVar3);
              if ((0 < pDVar6->extension_count_) ||
                 (pDVar6 = FieldDescriptor::message_type(pFVar3), 0 < pDVar6->extension_range_count_
                 )) {
                pcVar14 = (pFVar3->all_names_).payload_;
                pcVar15 = (char *)(ulong)*(ushort *)(pcVar14 + 2);
                pcVar14 = pcVar14 + ~(ulong)pcVar15;
                pcVar17 = "Nested extensions in feature extension ";
                goto LAB_00295055;
              }
              local_f8.node_ =
                   (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                    *)0x1;
            }
            else {
              pcVar14 = (pFVar3->all_names_).payload_;
              local_e8._0_8_ = ZEXT28(*(ushort *)(pcVar14 + 2));
              local_e8._8_8_ = pcVar14 + ~local_e8._0_8_;
              local_88._0_8_ = (StatusRep *)0x4b;
              local_88._8_8_ =
                   "Only singular features extensions are supported.  Found repeated extension ";
              absl::lts_20250127::StrCat_abi_cxx11_
                        (&local_a8,(lts_20250127 *)local_88,(AlphaNum *)local_e8,
                         (AlphaNum *)local_e8._8_8_);
              message._M_str = (char *)local_a8._M_string_length;
              message._M_len = (size_t)&local_f8;
              absl::lts_20250127::FailedPreconditionError(message);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          else {
            pcVar14 = (pFVar3->all_names_).payload_;
            uVar2 = *(ushort *)(pcVar14 + 2);
            local_88._8_8_ = ((DescriptorNames *)(local_d8.message_.field_2._8_8_ + 0x10))->payload_
            ;
            local_88._0_8_ = ZEXT28(*(ushort *)(local_88._8_8_ + 2));
            local_88._8_8_ = ~local_88._0_8_ + local_88._8_8_;
            args_1._M_str._0_2_ = uVar2;
            args_1._M_len = (size_t)"Extension ";
            args_1._M_str._2_6_ = 0;
            args_3._M_str = ".";
            args_3._M_len = (size_t)" is not an extension of ";
            protobuf::(anonymous_namespace)::
            Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                      ((char *)&local_f8,args_1,pcVar14 + ~(ulong)uVar2,args_3,
                       (char *)local_88._0_8_);
          }
          if (local_f8.node_ !=
              (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
               *)0x1) {
            absl::lts_20250127::internal_statusor::
            StatusOrData<google::protobuf::FeatureSetDefaults>::
            StatusOrData<const_absl::lts_20250127::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::FeatureSetDefaults>,(Status *)&local_f8
                      );
            this_00 = &local_f8;
LAB_00295276:
            absl::lts_20250127::Status::~Status((Status *)this_00);
            if (!bVar20) {
              return __return_storage_ptr__;
            }
            break;
          }
          pDVar6 = FieldDescriptor::message_type(pFVar3);
          anon_unknown_21::ValidateDescriptor((anon_unknown_21 *)local_88,pDVar6);
          if ((StatusRep *)local_88._0_8_ != (StatusRep *)0x1) {
            absl::lts_20250127::internal_statusor::
            StatusOrData<google::protobuf::FeatureSetDefaults>::
            StatusOrData<const_absl::lts_20250127::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::FeatureSetDefaults>,(Status *)local_88)
            ;
            this_00 = (btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                       *)local_88;
            goto LAB_00295276;
          }
          lVar16 = lVar16 + 8;
          bVar20 = (long)ppFVar13 * 8 - lVar16 == 0;
        } while (!bVar20);
      }
      local_a8._M_dataplus._M_p =
           absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
           ::EmptyNode()::empty_node;
      local_a8._M_string_length =
           (size_type)
           absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
           ::EmptyNode()::empty_node;
      local_a8.field_2._M_allocated_capacity = 0;
      anon_unknown_21::CollectEditions
                ((Descriptor *)local_d8.message_.field_2._8_8_,minimum_edition,
                 (btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
                  *)&local_a8);
      if (ppFVar13 != (pointer)0x0) {
        lVar16 = 0;
        do {
          pDVar6 = FieldDescriptor::message_type
                             (*(FieldDescriptor **)(&local_50->super_SymbolBase + lVar16));
          anon_unknown_21::CollectEditions
                    (pDVar6,minimum_edition,
                     (btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
                      *)&local_a8);
          lVar16 = lVar16 + 8;
        } while ((long)ppFVar13 * 8 - lVar16 != 0);
      }
      if (local_a8.field_2._M_allocated_capacity == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                   ,0x1c4,"!editions.empty()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_88);
      }
      iVar21 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                        *)&local_a8);
      local_88._0_8_ = iVar21.node_;
      local_88._8_4_ = iVar21.position_;
      pEVar8 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
               ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                            *)local_88);
      if (*pEVar8 == EDITION_LEGACY) {
        iVar21 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                 ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                          *)&local_a8);
        local_88._0_8_ = iVar21.node_;
        local_88._8_4_ = iVar21.position_;
        pEVar8 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                              *)local_88);
        if ((int)EVar19 < (int)*pEVar8) {
          iVar21 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                   ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                            *)&local_a8);
          local_88._0_8_ = iVar21.node_;
          local_88._8_4_ = iVar21.position_;
          pEVar8 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                   ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                                *)local_88);
          protobuf::(anonymous_namespace)::
          Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
                    ((_anonymous_namespace_ *)local_e8,"Minimum edition ",EVar19,
                     " is earlier than the oldest valid edition ",*pEVar8);
          absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>
          ::StatusOrData<absl::lts_20250127::Status,_0>
                    (&__return_storage_ptr__->
                      super_StatusOrData<google::protobuf::FeatureSetDefaults>,(Status *)local_e8);
          absl::lts_20250127::Status::~Status((Status *)local_e8);
        }
        else {
          FeatureSetDefaults::FeatureSetDefaults((FeatureSetDefaults *)local_88,(Arena *)0x0);
          FeatureSetDefaults::set_minimum_edition((FeatureSetDefaults *)local_88,EVar19);
          FeatureSetDefaults::set_maximum_edition((FeatureSetDefaults *)local_88,minimum_edition);
          std::make_unique<google::protobuf::DynamicMessageFactory>();
          iVar21 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                   ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                            *)&local_a8);
          local_f8.node_ =
               (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                *)iVar21.node_;
          local_f8.position_ = iVar21.position_;
          iVar21 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                   ::end((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                          *)&local_a8);
          local_40 = iVar21.node_;
          local_44 = iVar21.position_;
          local_38 = (long)ppFVar13 * 8;
          while( true ) {
            other.position_ = local_44;
            other.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                           *)local_40;
            other._12_4_ = 0;
            bVar20 = absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                     ::Equals(&local_f8,other);
            if (bVar20) break;
            pEVar8 = absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                     ::operator*(&local_f8);
            pMVar9 = (MessageLite *)
                     (**(code **)(*(long *)local_d8.payloads_._M_t.
                                           super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                                           .
                                           super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
                                           ._M_head_impl + 0x10))();
            pMVar9 = MessageLite::New(pMVar9,(Arena *)0x0);
            pMVar10 = (MessageLite *)
                      (**(code **)(*(long *)local_d8.payloads_._M_t.
                                            super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                                            .
                                            super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
                                            ._M_head_impl + 0x10))();
            pMVar10 = MessageLite::New(pMVar10,(Arena *)0x0);
            anon_unknown_21::FillDefaults
                      ((Edition)local_e8,(Message *)(ulong)*pEVar8,(Message *)pMVar9);
            if ((StatusRep *)local_e8._0_8_ != (StatusRep *)0x1) {
              absl::lts_20250127::internal_statusor::
              StatusOrData<google::protobuf::FeatureSetDefaults>::
              StatusOrData<const_absl::lts_20250127::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::FeatureSetDefaults>,
                         (Status *)local_e8);
              absl::lts_20250127::Status::~Status((Status *)local_e8);
LAB_0029572d:
              (*pMVar10->_vptr_MessageLite[1])(pMVar10);
              (*pMVar9->_vptr_MessageLite[1])(pMVar9);
              goto LAB_00295740;
            }
            if (ppFVar13 != (pointer)0x0) {
              lVar16 = 0;
              do {
                pFVar3 = *(FieldDescriptor **)(&local_50->super_SymbolBase + lVar16);
                EVar19 = *pEVar8;
                MVar22 = Message::GetMetadata((Message *)pMVar9);
                overridable = Reflection::MutableMessage
                                        (MVar22.reflection,(Message *)pMVar9,pFVar3,
                                         (MessageFactory *)0x0);
                MVar22 = Message::GetMetadata((Message *)pMVar10);
                Reflection::MutableMessage
                          (MVar22.reflection,(Message *)pMVar10,pFVar3,(MessageFactory *)0x0);
                anon_unknown_21::FillDefaults
                          ((Edition)local_e8,(Message *)(ulong)EVar19,overridable);
                if ((StatusRep *)local_e8._0_8_ != (StatusRep *)0x1) {
                  absl::lts_20250127::internal_statusor::
                  StatusOrData<google::protobuf::FeatureSetDefaults>::
                  StatusOrData<const_absl::lts_20250127::Status,_0>
                            (&__return_storage_ptr__->
                              super_StatusOrData<google::protobuf::FeatureSetDefaults>,
                             (Status *)local_e8);
                  absl::lts_20250127::Status::~Status((Status *)local_e8);
                  goto LAB_0029572d;
                }
                lVar16 = lVar16 + 8;
              } while (local_38 != lVar16);
            }
            pvVar11 = internal::RepeatedPtrFieldBase::AddMessageLite
                                ((RepeatedPtrFieldBase *)(local_88 + 0x18),
                                 Arena::
                                 DefaultConstruct<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                                );
            EVar19 = *pEVar8;
            bVar20 = internal::ValidateEnum(EVar19,(uint32_t *)Edition_internal_data_);
            if (!bVar20) {
              __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::Edition_internal_data_)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                            ,0x5164,
                            "void google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::_internal_set_edition(::google::protobuf::Edition)"
                           );
            }
            *(Edition *)((long)pvVar11 + 0x28) = EVar19;
            *(byte *)((long)pvVar11 + 0x10) = *(byte *)((long)pvVar11 + 0x10) | 6;
            if (*(long *)((long)pvVar11 + 0x20) == 0) {
              pAVar18 = *(Arena **)((long)pvVar11 + 8);
              if (((ulong)pAVar18 & 1) != 0) {
                pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
              }
              pvVar12 = Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar18);
              *(void **)((long)pvVar11 + 0x20) = pvVar12;
            }
            pMVar4 = *(MessageLite **)((long)pvVar11 + 0x20);
            MessageLite::SerializeAsString_abi_cxx11_((string *)local_e8,pMVar9);
            data._M_str = (char *)local_e8._0_8_;
            data._M_len = local_e8._8_8_;
            MessageLite::MergeFromString(pMVar4,data);
            if ((StatusRep *)local_e8._0_8_ != &local_d8) {
              operator_delete((void *)local_e8._0_8_,local_d8._0_8_ + 1);
            }
            *(byte *)((long)pvVar11 + 0x10) = *(byte *)((long)pvVar11 + 0x10) | 1;
            if (*(long *)((long)pvVar11 + 0x18) == 0) {
              pAVar18 = *(Arena **)((long)pvVar11 + 8);
              if (((ulong)pAVar18 & 1) != 0) {
                pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
              }
              pvVar12 = Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar18);
              *(void **)((long)pvVar11 + 0x18) = pvVar12;
            }
            pMVar4 = *(MessageLite **)((long)pvVar11 + 0x18);
            MessageLite::SerializeAsString_abi_cxx11_((string *)local_e8,pMVar10);
            data_00._M_str = (char *)local_e8._0_8_;
            data_00._M_len = local_e8._8_8_;
            MessageLite::MergeFromString(pMVar4,data_00);
            if ((StatusRep *)local_e8._0_8_ != &local_d8) {
              operator_delete((void *)local_e8._0_8_,local_d8._0_8_ + 1);
            }
            (*pMVar10->_vptr_MessageLite[1])(pMVar10);
            (*pMVar9->_vptr_MessageLite[1])(pMVar9);
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
            ::increment(&local_f8);
          }
          FeatureSetDefaults::FeatureSetDefaults
                    (&(__return_storage_ptr__->
                      super_StatusOrData<google::protobuf::FeatureSetDefaults>).field_1.data_,
                     (Arena *)0x0,(FeatureSetDefaults *)local_88);
          (__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>).field_0
               = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)
                 0x1;
LAB_00295740:
          if (local_d8.payloads_._M_t.
              super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
              .
              super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               )0x0) {
            (**(code **)((((Storage *)
                          local_d8.payloads_._M_t.
                          super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                          .
                          super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
                          ._M_head_impl)->metadata_).
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                         .super_Storage<unsigned_long,_1UL,_false>.value + 8))();
          }
          FeatureSetDefaults::~FeatureSetDefaults((FeatureSetDefaults *)local_88);
        }
      }
      else {
        iVar21 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                 ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                          *)&local_a8);
        local_88._0_8_ = iVar21.node_;
        local_88._8_4_ = iVar21.position_;
        pEVar8 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                              *)local_88);
        protobuf::(anonymous_namespace)::Error<char_const*,google::protobuf::Edition,char_const*>
                  ((_anonymous_namespace_ *)local_e8,"Minimum edition ",*pEVar8,
                   " is not EDITION_LEGACY");
        absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
        StatusOrData<absl::lts_20250127::Status,_0>
                  (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>
                   ,(Status *)local_e8);
        if ((local_e8._0_8_ & 1) == 0) {
          absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_e8._0_8_);
        }
      }
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
      ::~btree((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                *)&local_a8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSetDefaults> FeatureResolver::CompileDefaults(
    const Descriptor* feature_set,
    absl::Span<const FieldDescriptor* const> extensions,
    Edition minimum_edition, Edition maximum_edition) {
  if (minimum_edition > maximum_edition) {
    return Error("Invalid edition range, edition ", minimum_edition,
                 " is newer than edition ", maximum_edition);
  }
  // Find and validate the FeatureSet in the pool.
  if (feature_set == nullptr) {
    return Error(
        "Unable to find definition of google.protobuf.FeatureSet in descriptor pool.");
  }
  RETURN_IF_ERROR(ValidateDescriptor(*feature_set));

  // Collect and validate all the FeatureSet extensions.
  for (const auto* extension : extensions) {
    RETURN_IF_ERROR(ValidateExtension(*feature_set, extension));
    RETURN_IF_ERROR(ValidateDescriptor(*extension->message_type()));
  }

  // Collect all the editions with unique defaults.
  absl::btree_set<Edition> editions;
  CollectEditions(*feature_set, maximum_edition, editions);
  for (const auto* extension : extensions) {
    CollectEditions(*extension->message_type(), maximum_edition, editions);
  }
  // Sanity check validation conditions above.
  ABSL_CHECK(!editions.empty());
  if (*editions.begin() != EDITION_LEGACY) {
    return Error("Minimum edition ", *editions.begin(),
                 " is not EDITION_LEGACY");
  }

  if (*editions.begin() > minimum_edition) {
    return Error("Minimum edition ", minimum_edition,
                 " is earlier than the oldest valid edition ",
                 *editions.begin());
  }

  // Fill the default spec.
  FeatureSetDefaults defaults;
  defaults.set_minimum_edition(minimum_edition);
  defaults.set_maximum_edition(maximum_edition);
  auto message_factory = absl::make_unique<DynamicMessageFactory>();
  for (const auto& edition : editions) {
    auto fixed_defaults_dynamic =
        absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
    auto overridable_defaults_dynamic =
        absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
    RETURN_IF_ERROR(FillDefaults(edition, *fixed_defaults_dynamic,
                                 *overridable_defaults_dynamic));
    for (const auto* extension : extensions) {
      RETURN_IF_ERROR(FillDefaults(
          edition,
          *fixed_defaults_dynamic->GetReflection()->MutableMessage(
              fixed_defaults_dynamic.get(), extension),
          *overridable_defaults_dynamic->GetReflection()->MutableMessage(
              overridable_defaults_dynamic.get(), extension)));
    }
    auto* edition_defaults = defaults.mutable_defaults()->Add();
    edition_defaults->set_edition(edition);
    edition_defaults->mutable_fixed_features()->MergeFromString(
        fixed_defaults_dynamic->SerializeAsString());
    edition_defaults->mutable_overridable_features()->MergeFromString(
        overridable_defaults_dynamic->SerializeAsString());
  }
  return defaults;
}